

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.t.cpp
# Opt level: O0

bool __thiscall dynamicgraph::TimeDependency<int>::needUpdate(TimeDependency<int> *this,int *t1)

{
  DependencyType DVar1;
  SignalBase<int> *pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bool *pbVar7;
  undefined4 extraout_var;
  reference ppSVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SignalBase<int> *sig;
  const_iterator it;
  const_iterator itend;
  bool res;
  int *t1_local;
  TimeDependency<int> *this_local;
  
  pbVar7 = SignalBase<int>::getReady(this->leader);
  if ((*pbVar7 & 1U) == 0) {
    if (this->lastAskForUpdate == 0) {
      DVar1 = this->dependencyType;
      if (DVar1 == TIME_DEPENDENT) {
        iVar4 = *t1;
        iVar5 = (*this->leader->_vptr_SignalBase[2])();
        if (iVar4 < *(int *)CONCAT44(extraout_var,iVar5) + this->periodTime) {
          return false;
        }
      }
      else if ((DVar1 != BOOL_DEPENDENT) && (DVar1 == ALWAYS_READY)) {
        return true;
      }
      itend._M_node._7_1_ = (bool)(this->updateFromAllChildren & 1);
      it = std::__cxx11::
           list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
           ::end(&this->dependencies);
      sig = (SignalBase<int> *)
            std::__cxx11::
            list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
            ::begin(&this->dependencies);
      while (bVar3 = std::operator!=((_Self *)&sig,&it), bVar3) {
        ppSVar8 = std::_List_const_iterator<const_dynamicgraph::SignalBase<int>_*>::operator*
                            ((_List_const_iterator<const_dynamicgraph::SignalBase<int>_*> *)&sig);
        pSVar2 = *ppSVar8;
        iVar4 = (*pSVar2->_vptr_SignalBase[2])();
        iVar4 = *(int *)CONCAT44(extraout_var_00,iVar4);
        iVar5 = (*this->leader->_vptr_SignalBase[2])();
        if ((*(int *)CONCAT44(extraout_var_01,iVar5) < iVar4) ||
           (uVar6 = (*pSVar2->_vptr_SignalBase[9])(pSVar2,t1), (uVar6 & 1) != 0)) {
          if ((this->updateFromAllChildren & 1U) == 0) {
            itend._M_node._7_1_ = true;
            break;
          }
        }
        else if ((this->updateFromAllChildren & 1U) != 0) {
          itend._M_node._7_1_ = false;
          break;
        }
        std::_List_const_iterator<const_dynamicgraph::SignalBase<int>_*>::operator++
                  ((_List_const_iterator<const_dynamicgraph::SignalBase<int>_*> *)&sig);
      }
      this->lastAskForUpdate = (uint)itend._M_node._7_1_;
      this_local._7_1_ = itend._M_node._7_1_;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TimeDependency<Time>::needUpdate(const Time &t1) const {
  dgTDEBUG(15) << "# In {" << leader.getName() << " : (" << leader.getReady()
               << ") " << t1 << " >? " << leader.getTime() << std::endl;

  if (leader.getReady()) {
    dgTDEBUGOUT(15);
    return true;
  }
  if (lastAskForUpdate) {
    dgTDEBUGOUT(15);
    return true;
  }

  switch (dependencyType) {
    case ALWAYS_READY: {
      dgTDEBUGOUT(15);
      return true;
    }
    case BOOL_DEPENDENT:
      break;
    case TIME_DEPENDENT: {
      if (t1 < leader.getTime() + periodTime) {
        dgTDEBUGOUT(15);
        return false;
      }
      break;
    }
  };

  bool res = updateFromAllChildren;
  const typename Dependencies::const_iterator itend = dependencies.end();
  for (typename Dependencies::const_iterator it = dependencies.begin();
       it != itend; ++it) {
    const SignalBase<Time> &sig = **it;
    dgTDEBUG(15) << "Ask update for " << sig << std::endl;

    if ((sig.getTime() > leader.getTime()) || (sig.needUpdate(t1))) {
      if (updateFromAllChildren)
        continue;
      else {
        res = true;
        break;
      }
    } else {
      if (updateFromAllChildren) {
        res = false;
        break;
      } else
        continue;
    }
  }
  lastAskForUpdate = res;

  dgTDEBUGOUT(15);
  return res;
}